

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O3

void duckdb::AgeFunctionStandard(DataChunk *input,ExpressionState *state,Vector *result)

{
  buffer_ptr<ValidityBuffer> *this;
  element_type *count;
  interval_t *piVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  data_ptr_t pdVar4;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var5;
  timestamp_t tVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  byte bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  SelectionVector *pSVar10;
  data_ptr_t pdVar11;
  element_type *peVar12;
  date_t date;
  ClientContext *context;
  MetaTransaction *pMVar13;
  timestamp_t timestamp_1;
  reference vector;
  undefined1 *puVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  element_type *peVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  ulong uVar18;
  ValidityMask *args;
  idx_t idx_in_entry;
  element_type *peVar19;
  ulong uVar20;
  idx_t idx_in_entry_1;
  ulong uVar21;
  int64_t *piVar22;
  interval_t iVar23;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  int64_t *local_c8;
  idx_t local_c0;
  data_ptr_t local_b8;
  buffer_ptr<ValidityBuffer> *local_b0;
  ValidityMask *local_a8;
  ulong local_a0;
  UnifiedVectorFormat local_98;
  ulong local_48;
  ulong local_40;
  data_ptr_t local_38;
  
  context = ExpressionState::GetContext(state);
  pMVar13 = MetaTransaction::Get(context);
  date = Timestamp::GetDate((timestamp_t)(pMVar13->start_timestamp).value);
  timestamp_1 = Timestamp::FromDatetime(date,(dtime_t)0x0);
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  count = (element_type *)input->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_c8 = (int64_t *)result->data;
    local_b8 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != (element_type *)0x0) {
        local_c8 = (int64_t *)((long)local_c8 + 8);
        peVar19 = (element_type *)0x0;
        do {
          tVar6.value = *(int64_t *)(local_b8 + (long)peVar19 * 8);
          if ((tVar6.value == -0x7fffffffffffffff) || (tVar6.value == 0x7fffffffffffffff)) {
            _Var15._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var15._M_head_impl == (unsigned_long *)0x0) {
              local_d8 = (element_type *)
                         (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_98,(unsigned_long *)&local_d8);
              pdVar4 = local_98.data;
              pSVar10 = local_98.sel;
              local_98.sel = (SelectionVector *)0x0;
              local_98.data = (data_ptr_t)0x0;
              p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar10;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar4;
              if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var15._M_head_impl =
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var15._M_head_impl;
            }
            bVar8 = (byte)peVar19 & 0x3f;
            _Var15._M_head_impl[(ulong)peVar19 >> 6] =
                 _Var15._M_head_impl[(ulong)peVar19 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            iVar23 = (interval_t)ZEXT816(0);
          }
          else {
            iVar23 = Interval::GetAge(timestamp_1,tVar6);
          }
          local_c8[-1] = iVar23._0_8_;
          *local_c8 = iVar23.micros;
          peVar19 = (element_type *)
                    ((long)&(peVar19->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t + 1);
          local_c8 = local_c8 + 2;
        } while (count != peVar19);
      }
    }
    else {
      args = &vector->validity;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
      local_d8 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_98,(unsigned_long **)args,(unsigned_long *)&local_d8);
      pdVar4 = local_98.data;
      pSVar10 = local_98.sel;
      local_b0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      local_98.sel = (SelectionVector *)0x0;
      local_98.data = (data_ptr_t)0x0;
      p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pSVar10;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar4;
      if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data);
      }
      pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(local_b0)
      ;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar17->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      puVar14 = (undefined1 *)
                ((long)&count[7].owned_data.
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t + 7);
      if ((undefined1 *)0x3f < puVar14) {
        local_a0 = (ulong)puVar14 >> 6;
        local_c8 = (int64_t *)((long)local_c8 + 8);
        peVar19 = (element_type *)0x0;
        local_40 = 0;
        local_a8 = args;
        do {
          pdVar4 = local_b8;
          puVar2 = (args->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            peVar16 = peVar19 + 8;
            if (count <= peVar19 + 8) {
              peVar16 = count;
            }
LAB_0199d276:
            peVar12 = peVar19;
            if (peVar19 < peVar16) {
              piVar22 = (int64_t *)((long)local_c8 + (long)peVar19 * 0x10);
              do {
                tVar6.value = *(int64_t *)(pdVar4 + (long)peVar19 * 8);
                if ((tVar6.value == -0x7fffffffffffffff) || (tVar6.value == 0x7fffffffffffffff)) {
                  _Var15._M_head_impl =
                       (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                  if (_Var15._M_head_impl == (unsigned_long *)0x0) {
                    local_d8 = (element_type *)
                               (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,(unsigned_long *)&local_d8);
                    pdVar11 = local_98.data;
                    pSVar10 = local_98.sel;
                    local_98.sel = (SelectionVector *)0x0;
                    local_98.data = (data_ptr_t)0x0;
                    p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)pSVar10;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar11;
                    if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data !=
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data);
                    }
                    pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_b0);
                    _Var15._M_head_impl =
                         (pTVar17->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                         _Var15._M_head_impl;
                  }
                  bVar8 = (byte)peVar19 & 0x3f;
                  _Var15._M_head_impl[(ulong)peVar19 >> 6] =
                       _Var15._M_head_impl[(ulong)peVar19 >> 6] &
                       (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                  iVar23 = (interval_t)ZEXT816(0);
                }
                else {
                  iVar23 = Interval::GetAge(timestamp_1,tVar6);
                }
                piVar22[-1] = iVar23._0_8_;
                *piVar22 = iVar23.micros;
                peVar19 = (element_type *)
                          ((long)&(peVar19->owned_data).
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  ._M_t + 1);
                piVar22 = piVar22 + 2;
                args = local_a8;
                peVar12 = peVar16;
              } while (peVar16 != peVar19);
            }
          }
          else {
            uVar3 = puVar2[local_40];
            peVar16 = peVar19 + 8;
            if (count <= peVar19 + 8) {
              peVar16 = count;
            }
            peVar12 = peVar16;
            if (uVar3 != 0) {
              if (uVar3 == 0xffffffffffffffff) goto LAB_0199d276;
              uVar20 = (long)peVar16 - (long)peVar19;
              peVar12 = peVar19;
              if (peVar19 <= peVar16 && uVar20 != 0) {
                piVar22 = (int64_t *)((long)local_c8 + (long)peVar19 * 0x10);
                local_38 = local_b8 + (long)peVar19 * 8;
                uVar21 = 0;
                local_48 = uVar20;
                do {
                  if ((uVar3 >> (uVar21 & 0x3f) & 1) != 0) {
                    tVar6.value = *(int64_t *)(local_38 + uVar21 * 8);
                    if ((tVar6.value == -0x7fffffffffffffff) || (tVar6.value == 0x7fffffffffffffff))
                    {
                      _Var15._M_head_impl =
                           (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                      if (_Var15._M_head_impl == (unsigned_long *)0x0) {
                        local_d8 = (element_type *)
                                   (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                   capacity;
                        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                  ((duckdb *)&local_98,(unsigned_long *)&local_d8);
                        pdVar4 = local_98.data;
                        pSVar10 = local_98.sel;
                        local_98.sel = (SelectionVector *)0x0;
                        local_98.data = (data_ptr_t)0x0;
                        p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                 validity_data.internal.
                                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)pSVar10;
                        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar4;
                        if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data !=
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data);
                        }
                        pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                  operator->(local_b0);
                        _Var15._M_head_impl =
                             (pTVar17->owned_data).
                             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                             .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                             = _Var15._M_head_impl;
                        uVar20 = local_48;
                      }
                      uVar18 = (long)&(peVar19->owned_data).
                                      super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                      ._M_t + uVar21;
                      bVar8 = (byte)uVar18 & 0x3f;
                      _Var15._M_head_impl[uVar18 >> 6] =
                           _Var15._M_head_impl[uVar18 >> 6] &
                           (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                      iVar23 = (interval_t)ZEXT816(0);
                    }
                    else {
                      iVar23 = Interval::GetAge(timestamp_1,tVar6);
                    }
                    piVar22[-1] = iVar23._0_8_;
                    *piVar22 = iVar23.micros;
                  }
                  uVar21 = uVar21 + 1;
                  piVar22 = piVar22 + 2;
                  args = local_a8;
                  peVar12 = peVar16;
                } while (uVar20 != uVar21);
              }
            }
          }
          peVar19 = peVar12;
          local_40 = local_40 + 1;
        } while (local_40 != local_a0);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    piVar1 = (interval_t *)result->data;
    piVar22 = (int64_t *)vector->data;
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    tVar6.value = *piVar22;
    if ((tVar6.value == -0x7fffffffffffffff) || (tVar6.value == 0x7fffffffffffffff)) {
      _Var15._M_head_impl =
           (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (_Var15._M_head_impl == (unsigned_long *)0x0) {
        local_d8 = (element_type *)
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_98,(unsigned_long *)&local_d8);
        pdVar4 = local_98.data;
        pSVar10 = local_98.sel;
        local_98.sel = (SelectionVector *)0x0;
        local_98.data = (data_ptr_t)0x0;
        p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)pSVar10;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar4;
        if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data);
        }
        pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                              validity_data);
        _Var15._M_head_impl =
             (pTVar17->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             _Var15._M_head_impl;
      }
      *(byte *)_Var15._M_head_impl = (byte)*_Var15._M_head_impl & 0xfe;
      iVar23 = (interval_t)ZEXT816(0);
    }
    else {
      iVar23 = Interval::GetAge(timestamp_1,tVar6);
    }
    *piVar1 = iVar23;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_98);
    Vector::ToUnifiedFormat(vector,(idx_t)count,&local_98);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar4 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != (element_type *)0x0) {
        _Var5._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_98.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        piVar22 = (int64_t *)(pdVar4 + 8);
        peVar19 = (element_type *)0x0;
        do {
          peVar16 = peVar19;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var5._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            peVar16 = (element_type *)
                      (ulong)*(uint *)((long)_Var5._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl + (long)peVar19 * 4);
          }
          tVar6.value = (int64_t)((_func_int ***)local_98.data)[(long)peVar16];
          if ((tVar6.value == -0x7fffffffffffffff) || (tVar6.value == 0x7fffffffffffffff)) {
            _Var15._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var15._M_head_impl == (unsigned_long *)0x0) {
              local_c0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_d8,&local_c0);
              p_Var9 = p_Stack_d0;
              peVar16 = local_d8;
              local_d8 = (element_type *)0x0;
              p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar16;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                 p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var15._M_head_impl =
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var15._M_head_impl;
            }
            bVar8 = (byte)peVar19 & 0x3f;
            _Var15._M_head_impl[(ulong)peVar19 >> 6] =
                 _Var15._M_head_impl[(ulong)peVar19 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            iVar23 = (interval_t)ZEXT816(0);
          }
          else {
            iVar23 = Interval::GetAge(timestamp_1,tVar6);
          }
          piVar22[-1] = iVar23._0_8_;
          *piVar22 = iVar23.micros;
          peVar19 = (element_type *)
                    ((long)&(peVar19->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t + 1);
          piVar22 = piVar22 + 2;
        } while (count != peVar19);
      }
    }
    else if (count != (element_type *)0x0) {
      _Var5._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (((unsafe_unique_array<unsigned_long> *)&(local_98.sel)->sel_vector)->
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
      this = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      piVar22 = (int64_t *)(pdVar4 + 8);
      peVar19 = (element_type *)0x0;
      do {
        peVar16 = peVar19;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var5._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          peVar16 = (element_type *)
                    (ulong)*(uint *)((long)_Var5._M_t.
                                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                           .super__Head_base<0UL,_unsigned_long_*,_false>.
                                           _M_head_impl + (long)peVar19 * 4);
        }
        if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)peVar16 >> 6] >> ((ulong)peVar16 & 0x3f) & 1) == 0) {
          _Var15._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var15._M_head_impl == (unsigned_long *)0x0) {
            local_c0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_d8,&local_c0);
            p_Var9 = p_Stack_d0;
            peVar16 = local_d8;
            local_d8 = (element_type *)0x0;
            p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar16;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
               p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (this);
            _Var15._M_head_impl =
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var15._M_head_impl;
          }
          bVar8 = (byte)peVar19 & 0x3f;
          _Var15._M_head_impl[(ulong)peVar19 >> 6] =
               _Var15._M_head_impl[(ulong)peVar19 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          tVar6.value = (int64_t)((_func_int ***)local_98.data)[(long)peVar16];
          if ((tVar6.value == -0x7fffffffffffffff) || (tVar6.value == 0x7fffffffffffffff)) {
            _Var15._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var15._M_head_impl == (unsigned_long *)0x0) {
              local_c0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_d8,&local_c0);
              p_Var9 = p_Stack_d0;
              peVar16 = local_d8;
              local_d8 = (element_type *)0x0;
              p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar16;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                 p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (this);
              _Var15._M_head_impl =
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var15._M_head_impl;
            }
            bVar8 = (byte)peVar19 & 0x3f;
            _Var15._M_head_impl[(ulong)peVar19 >> 6] =
                 _Var15._M_head_impl[(ulong)peVar19 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            iVar23 = (interval_t)ZEXT816(0);
          }
          else {
            iVar23 = Interval::GetAge(timestamp_1,tVar6);
          }
          piVar22[-1] = iVar23._0_8_;
          *piVar22 = iVar23.micros;
        }
        peVar19 = (element_type *)
                  ((long)&(peVar19->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t + 1);
        piVar22 = piVar22 + 2;
      } while (count != peVar19);
    }
    if (local_98.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void AgeFunctionStandard(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 1);
	//	Subtract argument from current_date (at midnight)
	//	Theoretically, this should be TZ-sensitive, but since we have to be able to handle
	//	plain TZ when ICU is not loaded, we implement this in UTC (like everything else)
	//	To get the PG behaviour, we overload these functions in ICU for TSTZ arguments.
	auto current_date = Timestamp::FromDatetime(
	    Timestamp::GetDate(MetaTransaction::Get(state.GetContext()).start_timestamp), dtime_t(0));

	UnaryExecutor::ExecuteWithNulls<timestamp_t, interval_t>(input.data[0], result, input.size(),
	                                                         [&](timestamp_t input, ValidityMask &mask, idx_t idx) {
		                                                         if (Timestamp::IsFinite(input)) {
			                                                         return Interval::GetAge(current_date, input);
		                                                         } else {
			                                                         mask.SetInvalid(idx);
			                                                         return interval_t();
		                                                         }
	                                                         });
}